

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

int32_t repTextReplace(UText *ut,int64_t start,int64_t limit,UChar *src,int32_t length,
                      UErrorCode *status)

{
  long *plVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int32_t iVar7;
  ulong uVar9;
  ConstChar16Ptr local_90;
  UText *local_88;
  UChar *local_80;
  UnicodeString replStr;
  ulong uVar8;
  
  iVar7 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar7 = 0;
    if (length == 0 || src != (UChar *)0x0) {
      plVar1 = (long *)ut->context;
      local_88 = ut;
      iVar3 = (**(code **)(*plVar1 + 0x40))();
      if (limit < start) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      else {
        uVar5 = (ulong)iVar3;
        uVar8 = start;
        if ((long)uVar5 < start) {
          uVar8 = uVar5;
        }
        uVar8 = uVar8 & 0xffffffff;
        if (start < 0) {
          uVar8 = 0;
        }
        iVar6 = (int)uVar8;
        uVar9 = limit;
        if ((long)uVar5 < limit) {
          uVar9 = uVar5;
        }
        uVar5 = uVar9 & 0xffffffff;
        if (limit < 0) {
          uVar5 = 0;
        }
        if (((iVar6 < iVar3) && (uVar2 = (**(code **)(*plVar1 + 0x48))(plVar1,uVar8), 0 < iVar6)) &&
           ((uVar2 & 0xfc00) == 0xdc00)) {
          uVar2 = (**(code **)(*plVar1 + 0x48))(plVar1,iVar6 + -1);
          if ((uVar2 & 0xfc00) == 0xd800) {
            iVar6 = iVar6 + -1;
          }
        }
        iVar4 = (int)uVar5;
        if ((iVar4 < iVar3) &&
           (uVar2 = (**(code **)(*plVar1 + 0x48))(plVar1,iVar4 + -1), (uVar2 & 0xfc00) == 0xd800)) {
          uVar2 = (**(code **)(*plVar1 + 0x48))(plVar1,uVar5);
          uVar5 = (ulong)((uint)((uVar2 & 0xfc00) == 0xdc00) + iVar4);
        }
        local_90.p_ = src;
        icu_63::UnicodeString::UnicodeString(&replStr,(byte)((uint)length >> 0x1f),&local_90,length)
        ;
        local_80 = local_90.p_;
        (**(code **)(*plVar1 + 0x20))(plVar1,iVar6,uVar5,&replStr);
        iVar4 = (**(code **)(*plVar1 + 0x40))(plVar1);
        iVar7 = iVar4 - iVar3;
        if ((long)iVar6 < local_88->chunkNativeLimit) {
          local_88->chunkNativeLimit = 0;
          *(undefined8 *)&local_88->nativeIndexingLimit = 0;
          *(undefined8 *)((long)&local_88->chunkNativeStart + 4) = 0;
          local_88->chunkLength = 0;
        }
        repTextAccess(local_88,(long)((int)uVar5 + iVar7),'\x01');
        icu_63::UnicodeString::~UnicodeString(&replStr);
      }
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return iVar7;
}

Assistant:

static int32_t U_CALLCONV
repTextReplace(UText *ut,
               int64_t start, int64_t limit,
               const UChar *src, int32_t length,
               UErrorCode *status) {
    Replaceable *rep=(Replaceable *)ut->context;
    int32_t oldLength;

    if(U_FAILURE(*status)) {
        return 0;
    }
    if(src==NULL && length!=0) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    oldLength=rep->length(); // will subtract from new length
    if(start>limit ) {
        *status=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t start32 = pinIndex(start, oldLength);
    int32_t limit32 = pinIndex(limit, oldLength);

    // Snap start & limit to code point boundaries.
    if (start32<oldLength && U16_IS_TRAIL(rep->charAt(start32)) &&
        start32>0 && U16_IS_LEAD(rep->charAt(start32-1)))
    {
            start32--;
    }
    if (limit32<oldLength && U16_IS_LEAD(rep->charAt(limit32-1)) &&
        U16_IS_TRAIL(rep->charAt(limit32)))
    {
            limit32++;
    }

    // Do the actual replace operation using methods of the Replaceable class
    UnicodeString replStr((UBool)(length<0), src, length); // read-only alias
    rep->handleReplaceBetween(start32, limit32, replStr);
    int32_t newLength = rep->length();
    int32_t lengthDelta = newLength - oldLength;

    // Is the UText chunk buffer OK?
    if (ut->chunkNativeLimit > start32) {
        // this replace operation may have impacted the current chunk.
        // invalidate it, which will force a reload on the next access.
        invalidateChunk(ut);
    }

    // set the iteration position to the end of the newly inserted replacement text.
    int32_t newIndexPos = limit32 + lengthDelta;
    repTextAccess(ut, newIndexPos, TRUE);

    return lengthDelta;
}